

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_fruinfo.c
# Opt level: O0

uint8_t * IpmiFruAddCustomString(uint8_t *pos,char *key,char *value)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  uint8_t *puVar4;
  int local_30;
  int len2;
  int len1;
  char *value_local;
  char *key_local;
  uint8_t *pos_local;
  
  sVar2 = strlen(key);
  iVar1 = (int)sVar2;
  sVar3 = strlen(value);
  local_30 = (int)sVar3;
  pos_local = pos;
  if (((iVar1 != 0) || (local_30 != 0)) && (iVar1 + 1 < 0x40)) {
    if (0x3f < iVar1 + 1 + local_30) {
      local_30 = 0x3e - iVar1;
    }
    puVar4 = pos + 1;
    *pos = (char)sVar2 + -0x3f + (char)local_30;
    memcpy(puVar4,key,(long)iVar1);
    puVar4 = puVar4 + iVar1;
    *puVar4 = '=';
    memcpy(puVar4 + 1,value,(long)local_30);
    pos_local = puVar4 + 1 + local_30;
  }
  return pos_local;
}

Assistant:

uint8_t *IpmiFruAddCustomString(uint8_t *pos, const char *key, const char *value)
{
    int len1 = strlen(key);
    int len2 = strlen(value);
    if ((len1 == 0 && len2 == 0) || len1 + 1 > 63) {
        return pos;
    }
    if (len1 + 1 + len2 > 63) {
        len2 = 63 - len1 - 1;
    }
    *pos++ = 0xC0 + len1 + 1 + len2;
    memcpy(pos, key, len1);
    pos += len1;
    *pos++ = (uint8_t)'=';
    memcpy(pos, value, len2);
    pos += len2;
    return pos;
}